

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

int __thiscall cmCTestTestHandler::ProcessHandler(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  void *this_00;
  long *plVar9;
  size_t sVar10;
  ulong uVar11;
  _Base_ptr *pp_Var12;
  bool collapse;
  uint uVar13;
  pointer this_01;
  pointer pbVar14;
  pointer pcVar15;
  bool bVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passed;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  disabledTests;
  SetOfTests resultsSet;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_5;
  ostringstream cmCTestLog_msg_4;
  cmGeneratedFileStream mLogFile;
  long *local_af8;
  long local_ae8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ad8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ab8;
  float local_a9c;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  local_a98;
  ulong local_a80;
  double local_a78;
  double local_a70;
  _Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  local_a68;
  undefined1 local_a38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a28 [6];
  ios_base local_9c8 [912];
  long *local_638 [2];
  long local_628 [12];
  ios_base local_5c8 [264];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [568];
  undefined1 local_278 [584];
  
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"TestsToRunInformation","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  SetTestsToRunInformation(this,pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"UseUnion","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  bVar4 = cmSystemTools::IsOn(pcVar6);
  this->UseUnion = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"ScheduleRandom","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  bVar4 = cmSystemTools::IsOn(pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    local_a38._0_8_ = local_a28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"Random","");
    std::__cxx11::string::_M_assign((string *)&pcVar1->ScheduleType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a38._0_8_ != local_a28) {
      operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
    }
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"ParallelLevel","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    local_a38._0_8_ = local_a28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"ParallelLevel","");
    pcVar6 = cmCTestGenericHandler::GetOption
                       (&this->super_cmCTestGenericHandler,(string *)local_a38);
    iVar5 = atoi(pcVar6);
    cmCTest::SetParallelLevel(pcVar1,iVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a38._0_8_ != local_a28) {
      operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
    }
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"LabelRegularExpression","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    this->UseIncludeLabelRegExpFlag = true;
    pcVar2 = (char *)(this->IncludeLabelRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->IncludeLabelRegExp,0,pcVar2,(ulong)pcVar6);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"ExcludeLabelRegularExpression","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    this->UseExcludeLabelRegExpFlag = true;
    pcVar2 = (char *)(this->ExcludeLabelRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->ExcludeLabelRegExp,0,pcVar2,(ulong)pcVar6);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"IncludeRegularExpression","")
  ;
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    this->UseIncludeRegExpFlag = true;
    pcVar2 = (char *)(this->IncludeRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->IncludeRegExp,0,pcVar2,(ulong)pcVar6);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"ExcludeRegularExpression","")
  ;
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    this->UseExcludeRegExpFlag = true;
    this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
    pcVar2 = (char *)(this->ExcludeRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->ExcludeRegExp,0,pcVar2,(ulong)pcVar6);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"ExcludeFixtureRegularExpression","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar2 = (char *)(this->ExcludeFixtureRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->ExcludeFixtureRegExp,0,pcVar2,(ulong)pcVar6);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"ExcludeFixtureSetupRegularExpression","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar2 = (char *)(this->ExcludeFixtureSetupRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&this->ExcludeFixtureSetupRegExp,0,pcVar2,(ulong)pcVar6)
    ;
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"ExcludeFixtureCleanupRegularExpression","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  if (pcVar6 != (char *)0x0) {
    pcVar2 = (char *)(this->ExcludeFixtureCleanupRegExp)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace
              ((ulong)&this->ExcludeFixtureCleanupRegExp,0,pcVar2,(ulong)pcVar6);
  }
  local_a38._0_8_ = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"RerunFailed","");
  pcVar6 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_a38);
  bVar4 = cmSystemTools::IsOn(pcVar6);
  this->RerunFailed = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._0_8_ != local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28[0]._M_allocated_capacity + 1);
  }
  pcVar15 = (this->TestResults).
            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (this->TestResults).
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pcVar15;
  if (pcVar3 != pcVar15) {
    do {
      cmCTestTestResult::~cmCTestTestResult(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pcVar3);
    (this->TestResults).
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar15;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
  pcVar6 = "Memory check";
  if (this->MemCheck == false) {
    pcVar6 = "Test";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_a38,pcVar6,(ulong)this->MemCheck * 8 + 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38," project ",9);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_278,(SystemTools *)0x1,collapse);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_a38,(char *)local_278._0_8_,local_278._8_8_);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x1da,(char *)local_278._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a38);
  std::ios_base::~ios_base(local_9c8);
  iVar5 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[6])(this);
  if (iVar5 == 0) {
    return -1;
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
  pcVar6 = "Test";
  if (this->MemCheck != false) {
    pcVar6 = "DynamicAnalysis";
  }
  cmCTestGenericHandler::StartLogFile
            (&this->super_cmCTestGenericHandler,pcVar6,(cmGeneratedFileStream *)local_278);
  this->LogFile = (ostream *)local_278;
  local_ab8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ab8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ad8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ad8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a70 = cmsys::SystemTools::GetTime();
  ProcessDirectory(this,&local_ab8,&local_ad8);
  local_a78 = cmsys::SystemTools::GetTime();
  uVar13 = (int)((ulong)((long)local_ad8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_ad8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5) +
           (int)((ulong)((long)local_ab8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_ab8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_a80 = (ulong)uVar13;
  if (uVar13 == 0) {
    bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if ((!bVar4) && (((this->super_cmCTestGenericHandler).CTest)->PrintLabels == false)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a38,"No tests were found!!!",0x16);
      std::ios::widen((char)(ostream *)local_a38 + (char)*(undefined8 *)(local_a38._0_8_ + -0x18));
      std::ostream::put((char)local_a38);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,500,(char *)local_4c0._0_8_,false);
      if ((ostream *)local_4c0._0_8_ != (ostream *)local_4b0) {
        operator_delete((void *)local_4c0._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_4b0._0_8_)->_M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a38);
      std::ios_base::~ios_base(local_9c8);
    }
  }
  else {
    if (((local_ab8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_ab8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        ((this->super_cmCTestGenericHandler).HandlerVerbose != OUTPUT_NONE)) &&
       ((this->UseIncludeRegExpFlag != false || (this->UseExcludeRegExpFlag == true)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
      std::ios::widen((char)(ostringstream *)local_a38 +
                      (char)*(undefined8 *)(local_a38._0_8_ + -0x18));
      std::ostream::put((char)local_a38);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"The following tests passed:",0x1b);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x1fb,(char *)local_4c0._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((ostream *)local_4c0._0_8_ != (ostream *)local_4b0) {
        operator_delete((void *)local_4c0._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_4b0._0_8_)->_M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a38);
      std::ios_base::~ios_base(local_9c8);
      if (local_ab8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_ab8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar14 = local_ab8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a38,"\t",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_a38,(pbVar14->_M_dataplus)._M_p,
                              pbVar14->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x1ff,(char *)local_4c0._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((ostream *)local_4c0._0_8_ != (ostream *)local_4b0) {
            operator_delete((void *)local_4c0._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_4b0._0_8_)->_M_p + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a38);
          std::ios_base::~ios_base(local_9c8);
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 !=
                 local_ab8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    std::
    set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
    ::
    set<__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestResult*,std::vector<cmCTestTestHandler::cmCTestTestResult,std::allocator<cmCTestTestHandler::cmCTestTestResult>>>>
              ((set<cmCTestTestHandler::cmCTestTestResult,cmCTestTestHandler::cmCTestTestResultLess,std::allocator<cmCTestTestHandler::cmCTestTestResult>>
                *)&local_a68,
               (this->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_a98.
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a98.
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a98.
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((_Rb_tree_header *)local_a68._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_a68._M_impl.super__Rb_tree_header) {
      p_Var8 = local_a68._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar5 = strncmp((char *)p_Var8[6]._M_right,"SKIP_RETURN_CODE=",0x11);
        if ((iVar5 == 0) ||
           (iVar5 = std::__cxx11::string::compare((char *)&p_Var8[6]._M_right), iVar5 == 0)) {
          std::
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::push_back(&local_a98,(value_type *)(p_Var8 + 1));
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_a68._M_impl.super__Rb_tree_header);
    }
    local_a9c = ((float)(ulong)((long)local_ab8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_ab8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) * 100.0) /
                (float)(int)local_a80;
    bVar16 = local_ad8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_ad8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = local_a9c <= 99.0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a38);
    std::ios::widen((char)(ostringstream *)local_a38 +
                    (char)*(undefined8 *)(local_a38._0_8_ + -0x18));
    std::ostream::put((char)local_a38);
    this_00 = (void *)std::ostream::flush();
    iVar5 = 99;
    if (bVar16 || bVar4) {
      iVar5 = (int)(local_a9c + 0.5);
    }
    poVar7 = (ostream *)std::ostream::operator<<(this_00,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"% tests passed, ",0x10);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," tests failed out of ",0x15);
    plVar9 = (long *)std::ostream::operator<<(poVar7,(int)local_a80);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x219,(char *)local_4c0._0_8_,false);
    if ((ostream *)local_4c0._0_8_ != (ostream *)local_4b0) {
      operator_delete((void *)local_4c0._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_4b0._0_8_)->_M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a38);
    std::ios_base::~ios_base(local_9c8);
    cmCTest::GetLabelsForSubprojects_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a38,(this->super_cmCTestGenericHandler).CTest);
    if (local_a38._0_8_ == local_a38._8_8_) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a38);
LAB_002ec342:
      if (((this->super_cmCTestGenericHandler).CTest)->LabelSummary == true) {
        PrintLabelSummary(this);
      }
    }
    else {
      bVar4 = ((this->super_cmCTestGenericHandler).CTest)->SubprojectSummary;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a38);
      if (bVar4 != true) goto LAB_002ec342;
      PrintSubprojectSummary(this);
    }
    sprintf(local_a38,"%6.2f sec",SUB84(local_a78 - local_a70,0));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c0,"\nTotal Test time (real) = ",0x1a);
    sVar10 = strlen(local_a38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,local_a38,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"\n",1);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x226,(char *)local_638[0],(this->super_cmCTestGenericHandler).Quiet);
    if (local_638[0] != local_628) {
      operator_delete(local_638[0],local_628[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
    std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x60));
    if (local_a98.
        super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_a98.
        super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0,None);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
      std::ios::widen((char)(ostringstream *)local_638 + (char)local_638[0][-3]);
      std::ostream::put((char)local_638);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"The following tests did not run:",0x20);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x22b,(char *)local_af8,false);
      if (local_af8 != local_ae8) {
        operator_delete(local_af8,local_ae8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
      std::ios_base::~ios_base(local_5c8);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"TestsDisabled",
                 (cmGeneratedFileStream *)local_4c0);
      if (local_a98.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_a98.
          super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar15 = local_a98.
                  super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          poVar7 = (ostream *)std::ostream::operator<<(local_4c0,pcVar15->TestCount);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pcVar15->Name)._M_dataplus._M_p,
                              (pcVar15->Name)._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = std::__cxx11::string::compare((char *)&pcVar15->CompletionStatus);
          pcVar6 = "Skipped";
          if (iVar5 == 0) {
            pcVar6 = "Disabled";
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"\t",1);
          *(undefined8 *)((long)local_628 + local_638[0][-3]) = 3;
          poVar7 = (ostream *)
                   std::ostream::operator<<((ostringstream *)local_638,pcVar15->TestCount);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pcVar15->Name)._M_dataplus._M_p,
                              (pcVar15->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," (",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,(ulong)(iVar5 == 0) + 7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x23a,(char *)local_af8,false);
          if (local_af8 != local_ae8) {
            operator_delete(local_af8,local_ae8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
          std::ios_base::~ios_base(local_5c8);
          pcVar15 = pcVar15 + 1;
        } while (pcVar15 !=
                 local_a98.
                 super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
    }
    if (local_ad8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_ad8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0,None);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
      std::ios::widen((char)(ostringstream *)local_638 + (char)local_638[0][-3]);
      std::ostream::put((char)local_638);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"The following tests FAILED:",0x1b);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x241,(char *)local_af8,false);
      if (local_af8 != local_ae8) {
        operator_delete(local_af8,local_ae8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
      std::ios_base::~ios_base(local_5c8);
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"TestsFailed",(cmGeneratedFileStream *)local_4c0
                );
      if ((_Rb_tree_header *)local_a68._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_a68._M_impl.super__Rb_tree_header) {
        p_Var8 = local_a68._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (((*(int *)((long)&p_Var8[5]._M_parent + 4) != 9) &&
              (iVar5 = strncmp((char *)p_Var8[6]._M_right,"SKIP_RETURN_CODE=",0x11), iVar5 != 0)) &&
             (iVar5 = std::__cxx11::string::compare((char *)&p_Var8[6]._M_right), iVar5 != 0)) {
            poVar7 = (ostream *)std::ostream::operator<<(local_4c0,*(int *)&p_Var8[9]._M_right);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_638,"\t",1);
            *(undefined8 *)((long)local_628 + local_638[0][-3]) = 3;
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostringstream *)local_638,*(int *)&p_Var8[9]._M_right);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," (",2);
            uVar11 = (ulong)*(uint *)((long)&p_Var8[5]._M_parent + 4);
            pcVar6 = "No Status";
            if (uVar11 < 10) {
              pp_Var12 = (_Base_ptr *)(GetTestStatus::statuses + uVar11);
              if (uVar11 == 6) {
                pp_Var12 = &p_Var8[5]._M_left;
              }
              pcVar6 = (char *)*pp_Var12;
              if ((_Base_ptr)pcVar6 != (_Base_ptr)0x0) goto LAB_002eca3f;
              std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
            }
            else {
LAB_002eca3f:
              sVar10 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x24d,(char *)local_af8,false);
            if (local_af8 != local_ae8) {
              operator_delete(local_af8,local_ae8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
            std::ios_base::~ios_base(local_5c8);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != &local_a68._M_impl.super__Rb_tree_header);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4c0);
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::~vector(&local_a98);
    std::
    _Rb_tree<cmCTestTestHandler::cmCTestTestResult,_cmCTestTestHandler::cmCTestTestResult,_std::_Identity<cmCTestTestHandler::cmCTestTestResult>,_cmCTestTestHandler::cmCTestTestResultLess,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::~_Rb_tree(&local_a68);
  }
  bVar4 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar4) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_a38,None);
    pcVar6 = "Test";
    if (this->MemCheck != false) {
      pcVar6 = "DynamicAnalysis";
    }
    bVar4 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,(uint)this->MemCheck * 2 + PartTest,pcVar6
                       ,(cmGeneratedFileStream *)local_a38);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0,"Cannot create ",0xe);
      pcVar6 = "testing";
      if ((ulong)this->MemCheck != 0) {
        pcVar6 = "memory check";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4c0,pcVar6,(ulong)this->MemCheck * 5 + 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c0," XML file",9);
      std::ios::widen((char)(ostream *)local_4c0 +
                      (char)*(undefined8 *)&((ostream *)(local_4c0._0_8_ + -0x110))->field_0xf8);
      std::ostream::put((char)local_4c0);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x25a,(char *)local_638[0],false);
      if (local_638[0] != local_628) {
        operator_delete(local_638[0],local_628[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c0);
      std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x60));
      this->LogFile = (ostream *)0x0;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a38);
      iVar5 = 1;
      goto LAB_002ecd7c;
    }
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_4c0,(ostream *)local_a38,0);
    (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[9])(this,local_4c0);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_4c0);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a38);
  }
  iVar5 = (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[7])(this);
  if (iVar5 == 0) {
    this->LogFile = (ostream *)0x0;
    iVar5 = -1;
  }
  else {
    this->LogFile = (ostream *)0x0;
    iVar5 = -(uint)(local_ad8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                   local_ad8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  }
LAB_002ecd7c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ad8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ab8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return iVar5;
}

Assistant:

int cmCTestTestHandler::ProcessHandler()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(cmSystemTools::IsOn(this->GetOption("UseUnion")));
  if (cmSystemTools::IsOn(this->GetOption("ScheduleRandom"))) {
    this->CTest->SetScheduleType("Random");
  }
  if (this->GetOption("ParallelLevel")) {
    this->CTest->SetParallelLevel(atoi(this->GetOption("ParallelLevel")));
  }

  const char* val;
  val = this->GetOption("LabelRegularExpression");
  if (val) {
    this->UseIncludeLabelRegExpFlag = true;
    this->IncludeLabelRegExp = val;
  }
  val = this->GetOption("ExcludeLabelRegularExpression");
  if (val) {
    this->UseExcludeLabelRegExpFlag = true;
    this->ExcludeLabelRegExp = val;
  }
  val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = val;
  }
  this->SetRerunFailed(cmSystemTools::IsOn(this->GetOption("RerunFailed")));

  this->TestResults.clear();

  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT, (this->MemCheck ? "Memory check" : "Test")
      << " project " << cmSystemTools::GetCurrentWorkingDirectory()
      << std::endl,
    this->Quiet);
  if (!this->PreProcessHandler()) {
    return -1;
  }

  cmGeneratedFileStream mLogFile;
  this->StartLogFile((this->MemCheck ? "DynamicAnalysis" : "Test"), mLogFile);
  this->LogFile = &mLogFile;

  std::vector<std::string> passed;
  std::vector<std::string> failed;
  int total;

  // start the real time clock
  double clock_start, clock_finish;
  clock_start = cmSystemTools::GetTime();

  this->ProcessDirectory(passed, failed);

  clock_finish = cmSystemTools::GetTime();

  total = int(passed.size()) + int(failed.size());

  if (total == 0) {
    if (!this->CTest->GetShowOnly() && !this->CTest->ShouldPrintLabels()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "No tests were found!!!"
                   << std::endl);
    }
  } else {
    if (this->HandlerVerbose && !passed.empty() &&
        (this->UseIncludeRegExpFlag || this->UseExcludeRegExpFlag)) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl
                           << "The following tests passed:" << std::endl,
                         this->Quiet);
      for (std::vector<std::string>::iterator j = passed.begin();
           j != passed.end(); ++j) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "\t" << *j << std::endl, this->Quiet);
      }
    }

    typedef std::set<cmCTestTestHandler::cmCTestTestResult,
                     cmCTestTestResultLess>
      SetOfTests;
    SetOfTests resultsSet(this->TestResults.begin(), this->TestResults.end());
    std::vector<cmCTestTestHandler::cmCTestTestResult> disabledTests;

    for (SetOfTests::iterator ftit = resultsSet.begin();
         ftit != resultsSet.end(); ++ftit) {
      if (cmHasLiteralPrefix(ftit->CompletionStatus, "SKIP_RETURN_CODE=") ||
          ftit->CompletionStatus == "Disabled") {
        disabledTests.push_back(*ftit);
      }
    }

    float percent = float(passed.size()) * 100.0f / float(total);
    if (!failed.empty() && percent > 99) {
      percent = 99;
    }

    cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                 << static_cast<int>(percent + .5f) << "% tests passed, "
                 << failed.size() << " tests failed out of " << total
                 << std::endl);

    if (!this->CTest->GetLabelsForSubprojects().empty() &&
        this->CTest->GetSubprojectSummary()) {
      this->PrintSubprojectSummary();
    } else if (this->CTest->GetLabelSummary()) {
      this->PrintLabelSummary();
    }

    char realBuf[1024];
    sprintf(realBuf, "%6.2f sec", (double)(clock_finish - clock_start));
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "\nTotal Test time (real) = " << realBuf << "\n",
                       this->Quiet);

    if (!disabledTests.empty()) {
      cmGeneratedFileStream ofs;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                   << "The following tests did not run:" << std::endl);
      this->StartLogFile("TestsDisabled", ofs);

      const char* disabled_reason;
      for (std::vector<cmCTestTestHandler::cmCTestTestResult>::iterator dtit =
             disabledTests.begin();
           dtit != disabledTests.end(); ++dtit) {
        ofs << dtit->TestCount << ":" << dtit->Name << std::endl;
        if (dtit->CompletionStatus == "Disabled") {
          disabled_reason = "Disabled";
        } else {
          disabled_reason = "Skipped";
        }
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "\t"
                     << std::setw(3) << dtit->TestCount << " - " << dtit->Name
                     << " (" << disabled_reason << ")" << std::endl);
      }
    }

    if (!failed.empty()) {
      cmGeneratedFileStream ofs;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl
                   << "The following tests FAILED:" << std::endl);
      this->StartLogFile("TestsFailed", ofs);

      for (SetOfTests::iterator ftit = resultsSet.begin();
           ftit != resultsSet.end(); ++ftit) {
        if (ftit->Status != cmCTestTestHandler::COMPLETED &&
            !cmHasLiteralPrefix(ftit->CompletionStatus, "SKIP_RETURN_CODE=") &&
            ftit->CompletionStatus != "Disabled") {
          ofs << ftit->TestCount << ":" << ftit->Name << std::endl;
          cmCTestLog(this->CTest, HANDLER_OUTPUT, "\t"
                       << std::setw(3) << ftit->TestCount << " - "
                       << ftit->Name << " (" << this->GetTestStatus(&*ftit)
                       << ")" << std::endl);
        }
      }
    }
  }

  if (this->CTest->GetProduceXML()) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(
          (this->MemCheck ? cmCTest::PartMemCheck : cmCTest::PartTest),
          (this->MemCheck ? "DynamicAnalysis" : "Test"), xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create "
                   << (this->MemCheck ? "memory check" : "testing")
                   << " XML file" << std::endl);
      this->LogFile = CM_NULLPTR;
      return 1;
    }
    cmXMLWriter xml(xmlfile);
    this->GenerateDartOutput(xml);
  }

  if (!this->PostProcessHandler()) {
    this->LogFile = CM_NULLPTR;
    return -1;
  }

  if (!failed.empty()) {
    this->LogFile = CM_NULLPTR;
    return -1;
  }
  this->LogFile = CM_NULLPTR;
  return 0;
}